

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

int __thiscall
basist::basisu_transcoder::find_first_slice_index
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index)

{
  bool bVar1;
  uint uVar2;
  basis_file_header *pHeader;
  byte *pbVar3;
  ulong uVar4;
  ulong in_R9;
  
  uVar2 = (uint)*(byte *)((long)pData + 0xe) |
          (uint)*(byte *)((long)pData + 0xf) << 8 | (uint)*(byte *)((long)pData + 0x10) << 0x10;
  if (uVar2 != 0) {
    pbVar3 = (byte *)((long)pData + (ulong)*(uint *)((long)pData + 0x41) + 3);
    uVar4 = 0;
    do {
      bVar1 = true;
      if ((((uint)pbVar3[-3] | (uint)pbVar3[-2] << 8 | (uint)pbVar3[-1] << 0x10) == image_index) &&
         (*pbVar3 == level_index)) {
        bVar1 = false;
        in_R9 = uVar4 & 0xffffffff;
      }
      if (!bVar1) {
        return (int)in_R9;
      }
      uVar4 = uVar4 + 1;
      pbVar3 = pbVar3 + 0x17;
    } while (uVar2 != uVar4);
  }
  return -1;
}

Assistant:

int basisu_transcoder::find_first_slice_index(const void* pData, uint32_t data_size, uint32_t image_index, uint32_t level_index) const
	{
		BASISU_NOTE_UNUSED(data_size);

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);
		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		// For very large basis files this search could be painful
		// TODO: Binary search this
		for (uint32_t slice_iter = 0; slice_iter < pHeader->m_total_slices; slice_iter++)
		{
			const basis_slice_desc& slice_desc = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs)[slice_iter];
			if ((slice_desc.m_image_index == image_index) && (slice_desc.m_level_index == level_index))
				return slice_iter;
		}

		BASISU_DEVEL_ERROR("basisu_transcoder::find_first_slice_index: didn't find slice\n");

		return -1;
	}